

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AirLock.hpp
# Opt level: O0

optional<std::any> * __thiscall
gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>::try_unload
          (AirLock<std::any,_std::mutex,_std::condition_variable> *this)

{
  bool bVar1;
  optional<std::any> *in_RDI;
  lock_guard<std::mutex> lock;
  optional<std::any> *val;
  any *in_stack_ffffffffffffffb8;
  optional<std::any> *this_00;
  
  this_00 = in_RDI;
  bVar1 = std::atomic<bool>::load((atomic<bool> *)in_RDI,(memory_order)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_RDI,(mutex_type *)in_stack_ffffffffffffffb8);
    bVar1 = std::atomic<bool>::load((atomic<bool> *)this_00,(memory_order)((ulong)in_RDI >> 0x20));
    if (bVar1) {
      std::optional<std::any>::optional<std::any,_true>(in_RDI,in_stack_ffffffffffffffb8);
      std::atomic<bool>::store
                ((atomic<bool> *)this_00,SUB81((ulong)in_RDI >> 0x38,0),(memory_order)in_RDI);
      std::condition_variable::notify_one();
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x581d19);
    if (bVar1) {
      return this_00;
    }
  }
  std::optional<std::any>::optional(in_RDI);
  return this_00;
}

Assistant:

std::optional<T> try_unload()
    {
        if (loaded.load(std::memory_order_acquire)) {
            std::lock_guard<MUTEX> lock(door);
            // can use relaxed since we are behind a mutex
            if (loaded.load(std::memory_order_acquire)) {
                std::optional<T> val{std::move(data)};
                loaded.store(false, std::memory_order_release);
                condition.notify_one();
                return val;
            }
        }
        return std::nullopt;
    }